

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O1

void __thiscall
anurbs::NurbsSurfaceGeometry<3L>::NurbsSurfaceGeometry
          (NurbsSurfaceGeometry<3L> *this,Index degree_u,Index degree_v,VectorXd *knots_u,
          VectorXd *knots_v,Poles *poles)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  runtime_error *this_00;
  
  (this->super_SurfaceBase<3L>)._vptr_SurfaceBase =
       (_func_int **)&PTR__NurbsSurfaceGeometry_00384c08;
  this->m_degree_u = degree_u;
  this->m_degree_v = degree_v;
  this->m_nb_poles_u =
       ((knots_u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows -
       degree_u) + 1;
  this->m_nb_poles_v =
       ((knots_v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows -
       degree_v) + 1;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_knots_u,
             (DenseStorage<double,__1,__1,_1,_0> *)knots_u);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_knots_v,
             (DenseStorage<double,__1,__1,_1,_0> *)knots_v);
  Eigen::DenseStorage<double,_-1,_-1,_3,_1>::DenseStorage
            ((DenseStorage<double,__1,__1,_3,_1> *)&this->m_poles,
             (DenseStorage<double,__1,__1,_3,_1> *)poles);
  (this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_weights,0,0,1);
  lVar1 = (this->m_knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  iVar3 = (*(this->super_SurfaceBase<3L>)._vptr_SurfaceBase[2])(this);
  lVar2 = (this->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  iVar4 = (*(this->super_SurfaceBase<3L>)._vptr_SurfaceBase[3])(this);
  if (((lVar2 - CONCAT44(extraout_var_00,iVar4)) + 1) * ((lVar1 - CONCAT44(extraout_var,iVar3)) + 1)
      - (this->m_poles).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_1,__1,_3>_>.m_storage.
        m_rows == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Number of knots and poles do not match");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

NurbsSurfaceGeometry(
        const Index degree_u,
        const Index degree_v,
        const Eigen::VectorXd& knots_u,
        const Eigen::VectorXd& knots_v,
        const Poles& poles)
        : m_degree_u(degree_u)
        , m_degree_v(degree_v)
        , m_nb_poles_u(Nurbs::nb_poles(degree_u, length(knots_u)))
        , m_nb_poles_v(Nurbs::nb_poles(degree_v, length(knots_v)))
        , m_knots_u(knots_u)
        , m_knots_v(knots_v)
        , m_poles(poles)
        , m_weights(0)
    {
        static_assert(TDimension > 0);

        if (nb_poles_u() * nb_poles_v() != nb_poles()) {
            throw std::runtime_error("Number of knots and poles do not match");
        }
    }